

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree.c
# Opt level: O1

int kvtree_log(kvtree *hash,int log_level,int indent)

{
  uint indent_00;
  kvtree_elem_struct *pkVar1;
  size_t __n;
  char tmp [1024];
  char tmp_1 [1024];
  undefined1 auStack_838 [1024];
  undefined1 local_438 [1032];
  
  if (0 < indent) {
    memset(auStack_838,0x20,(ulong)(uint)indent);
  }
  auStack_838[indent] = 0;
  if (hash == (kvtree *)0x0) {
    kvtree_dbg(log_level,"%sNULL LIST\n",auStack_838);
  }
  else {
    pkVar1 = hash->lh_first;
    if (pkVar1 != (kvtree_elem_struct *)0x0) {
      indent_00 = indent + 2;
      __n = 1;
      if (1 < (int)indent_00) {
        __n = (size_t)indent_00;
      }
      do {
        if (-2 < indent) {
          memset(local_438,0x20,__n);
        }
        local_438[(int)indent_00] = 0;
        if (pkVar1->key == (char *)0x0) {
          kvtree_dbg(log_level,"%sNULL KEY\n",local_438);
        }
        else {
          kvtree_dbg(log_level,"%s%s\n",local_438);
        }
        kvtree_log(pkVar1->hash,log_level,indent_00);
        pkVar1 = (pkVar1->pointers).le_next;
      } while (pkVar1 != (kvtree_elem_struct *)0x0);
    }
  }
  return 0;
}

Assistant:

int kvtree_log(const kvtree* hash, int log_level, int indent)
{
  char tmp[KVTREE_MAX_FILENAME];
  int i;
  for (i = 0; i < indent; i++) {
    tmp[i] = ' ';
  }
  tmp[indent] = '\0';

  if (hash != NULL) {
    kvtree_elem* elem;
    LIST_FOREACH(elem, hash, pointers) {
      kvtree_elem_log(elem, log_level, indent+2);
    }
  } else {
    kvtree_dbg(log_level, "%sNULL LIST\n", tmp);
  }
  return KVTREE_SUCCESS;
}